

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_meth_act_msg(parser *p)

{
  parser_error pVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 *puVar4;
  
  pcVar2 = parser_getstr(p,"act");
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar4 = (undefined8 *)mem_zalloc(0x10);
    pcVar2 = string_make(pcVar2);
    *puVar4 = pcVar2;
    puVar4[1] = *(undefined8 *)((long)pvVar3 + 0x10);
    *(undefined8 **)((long)pvVar3 + 0x10) = puVar4;
    *(int *)((long)pvVar3 + 0x18) = *(int *)((long)pvVar3 + 0x18) + 1;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_meth_act_msg(struct parser *p) {
	const char *message = parser_getstr(p, "act");
	struct blow_method *meth = parser_priv(p);
	struct blow_message *msg;

	if (!meth) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	msg = mem_zalloc(sizeof(*msg));
	msg->act_msg = string_make(message);
	msg->next = meth->messages;
	meth->messages = msg;
	meth->num_messages++;
	return PARSE_ERROR_NONE;
}